

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SSD.cpp
# Opt level: O2

void findMatch(vector<Descriptor,_std::allocator<Descriptor>_> *keyPointDescriptor1,
              vector<Descriptor,_std::allocator<Descriptor>_> *keyPointDescriptor2,
              vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_> *keyPoint1,
              vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_> *keyPoint2,
              vector<cv::DMatch,_std::allocator<cv::DMatch>_> *dMatch,int threshold)

{
  Descriptor *pDVar1;
  pointer pDVar2;
  Descriptor *pDVar3;
  Descriptor *pDVar4;
  int iVar5;
  pointer pDVar6;
  float fVar7;
  Descriptor desp2;
  Descriptor desp1;
  float local_184;
  float local_180;
  float local_17c;
  undefined8 local_138;
  undefined1 local_128 [24];
  Descriptor local_110;
  Descriptor local_a0;
  
  pDVar1 = (keyPointDescriptor1->super__Vector_base<Descriptor,_std::allocator<Descriptor>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  iVar5 = 0;
  for (pDVar3 = (keyPointDescriptor1->super__Vector_base<Descriptor,_std::allocator<Descriptor>_>).
                _M_impl.super__Vector_impl_data._M_start; pDVar3 != pDVar1; pDVar3 = pDVar3 + 1) {
    Descriptor::Descriptor(&local_a0,pDVar3);
    pDVar6 = (keyPointDescriptor2->super__Vector_base<Descriptor,_std::allocator<Descriptor>_>).
             _M_impl.super__Vector_impl_data._M_start;
    pDVar2 = (keyPointDescriptor2->super__Vector_base<Descriptor,_std::allocator<Descriptor>_>).
             _M_impl.super__Vector_impl_data._M_finish;
    local_138 = 0;
    pDVar4 = (Descriptor *)0x0;
    local_184 = 3.4028235e+38;
    local_180 = 3.4028235e+38;
    local_128._0_4_ = 0;
    local_128._4_4_ = 0;
    for (; pDVar6 != pDVar2; pDVar6 = pDVar6 + 1) {
      Descriptor::Descriptor(&local_110,pDVar6);
      if (local_110.isPaired == false) {
        fVar7 = getDistance(&local_a0.v,&local_110.v);
        if (local_184 <= fVar7) {
          if (local_180 <= fVar7) {
            local_17c = local_184;
          }
          else {
            local_17c = local_184;
            local_180 = fVar7;
          }
        }
        else {
          local_128._0_4_ = local_a0.x;
          local_128._4_4_ = local_a0.y;
          local_138 = CONCAT44(local_110.y,local_110.x);
          pDVar4 = &local_110;
          local_180 = local_184;
          local_17c = fVar7;
        }
      }
      else {
        local_17c = local_184;
      }
      cv::Mat::~Mat(&local_110.v);
      local_184 = local_17c;
    }
    if ((local_184 <= (float)threshold) && (local_184 / local_180 <= 0.8)) {
      local_110.x = (int)(float)(int)local_128._0_4_;
      local_110.y = (int)(float)(int)local_128._4_4_;
      local_110.isPaired = false;
      local_110._9_7_ = 0xbf80000040a000;
      local_110.v = (Mat)0x0;
      local_110._17_7_ = 0;
      local_110._24_4_ = 0xffffffff;
      std::vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>::emplace_back<cv::KeyPoint>
                (keyPoint1,(KeyPoint *)&local_110);
      local_110.x = (int)(float)(int)local_138;
      local_110.y = (int)(float)local_138._4_4_;
      local_110.isPaired = false;
      local_110._9_7_ = 0xbf80000040a000;
      local_110.v = (Mat)0x0;
      local_110._17_7_ = 0;
      local_110._24_4_ = 0xffffffff;
      std::vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>::emplace_back<cv::KeyPoint>
                (keyPoint2,(KeyPoint *)&local_110);
      local_110.isPaired = true;
      local_110._9_7_ = 0x40400000ffffff;
      local_110.x = iVar5;
      local_110.y = iVar5;
      std::vector<cv::DMatch,_std::allocator<cv::DMatch>_>::emplace_back<cv::DMatch>
                (dMatch,(DMatch *)&local_110);
      iVar5 = iVar5 + 1;
      pDVar4->isPaired = true;
    }
    cv::Mat::~Mat(&local_a0.v);
  }
  return;
}

Assistant:

void findMatch(vector<Descriptor>& keyPointDescriptor1, vector<Descriptor>& keyPointDescriptor2, vector<KeyPoint>& keyPoint1, vector<KeyPoint>& keyPoint2, vector<DMatch>& dMatch, int threshold) {
	int idx = 0;
	for (Descriptor desp1 : keyPointDescriptor1) {
		Point bestPoint1;
		Point bestPoint2;
		Descriptor* bestDesp2=NULL;
		float bestDist = numeric_limits<float>::max();
		Point secondPoint1;
		Point secondPoint2;
		float secondDist = bestDist;
		for (Descriptor desp2 : keyPointDescriptor2) {
			//skip the keypoint if it has already been paired
			if (desp2.isPaired) continue;

			float dist = getDistance(desp1.v, desp2.v);
			if (dist < bestDist) {
				secondDist = bestDist;
				secondPoint1 = bestPoint1;
				secondPoint2 = bestPoint2;
				bestDist = dist;
				bestPoint1 = Point(desp1.x, desp1.y);
				bestPoint2 = Point(desp2.x, desp2.y);
				bestDesp2 = &desp2;
			}
			else if (dist < secondDist) {
				secondDist = dist;
				secondPoint1 = Point(desp1.x, desp1.y);
				secondPoint2 = Point(desp2.x, desp2.y);
			}
		}
		if (bestDist > threshold) continue;
		float ratio = bestDist / secondDist;
		if (ratio <= 0.8) {
			keyPoint1.push_back(KeyPoint(bestPoint1, 5));
			keyPoint2.push_back(KeyPoint(bestPoint2, 5));
			dMatch.push_back(DMatch(idx, idx, 3));
			++idx;
			(*bestDesp2).isPaired = true;
		}
	}
}